

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

IEngineGraphics * CreateEngineGraphicsThreaded(void)

{
  CGraphics_Threaded *this;
  
  this = (CGraphics_Threaded *)operator_new(0x1241b8);
  CGraphics_Threaded::CGraphics_Threaded(this);
  return (IEngineGraphics *)this;
}

Assistant:

extern IEngineGraphics *CreateEngineGraphicsThreaded()
{
#ifdef CONF_HEADLESS_CLIENT
	return new CGraphics_ThreadedNull();
#else
	return new CGraphics_Threaded();
#endif
}